

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_ftrunc_u_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  fpr_t *pfVar3;
  byte bVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  uint32_t uVar8;
  float32 fVar9;
  uint64_t uVar10;
  float64 fVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  uint uVar15;
  uint uVar17;
  long lVar18;
  uint64_t *puVar19;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_48;
  float64 afStack_40 [2];
  uint uVar16;
  
  lVar5 = (ulong)ws * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar18 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      uVar8 = float32_to_uint32_round_to_zero_mips64
                        (*(float32 *)((long)(env->active_fpu).fpr + lVar18 * 4 + lVar5 + -0x338),
                         pfVar2);
      *(uint32_t *)((long)afStack_40 + lVar18 * 4 + -8) = uVar8;
      bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar7 = ieee_ex_to_mips_mips64((uint)bVar4);
      uVar13 = (env->active_tc).msacsr;
      uVar12 = uVar13 >> 7 & 0x1f | 0x20;
      uVar17 = (uVar13 & 0x1000000) >> 0x18 & (uint)(bVar4 >> 6) | uVar7;
      uVar7 = (uVar7 & 0xfffffffc) + 1;
      if ((uVar13 & 0x1000000) == 0) {
        uVar7 = uVar17;
      }
      if (-1 < (char)bVar4) {
        uVar7 = uVar17;
      }
      uVar16 = (uint)((uVar13 >> 9 & 1) == 0 & (byte)uVar7 >> 2);
      uVar15 = uVar16 | uVar7;
      uVar17 = uVar7 & 0xfffffffc;
      if ((uVar16 != 0 || (uVar7 & 1) != 0) || (uVar13 & 0x100) != 0) {
        uVar17 = uVar15;
      }
      if ((uVar7 & 2) == 0) {
        uVar17 = uVar15;
      }
      if ((uVar17 & uVar12) == 0) {
        uVar7 = uVar17 << 0xc;
LAB_008c1d75:
        (env->active_tc).msacsr = uVar7 & 0x3f000 | uVar13;
        uVar12 = uVar13 >> 7 & 0x1f | 0x20;
      }
      else if ((uVar13 >> 0x12 & 1) == 0) {
        uVar7 = uVar17 << 0xc | uVar13;
        uVar13 = uVar13 & 0xfff80fff;
        goto LAB_008c1d75;
      }
      if ((uVar12 & uVar17) == 0) {
        uVar17 = 0;
        if (0x7f800000 <
            (*(uint *)((long)(env->active_fpu).fpr + lVar18 * 4 + lVar5 + -0x338) & 0x7fffffff))
        goto LAB_008c1dbb;
      }
      else {
        fVar9 = float32_default_nan_mips64(pfVar2);
        uVar17 = fVar9 & 0xffffffc0 ^ 0x400000 | uVar17;
LAB_008c1dbb:
        *(uint *)((long)afStack_40 + lVar18 * 4 + -8) = uVar17;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1b3a,
                    "void helper_msa_ftrunc_u_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    puVar19 = &local_48;
    lVar18 = 0;
    bVar6 = true;
    do {
      bVar14 = bVar6;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      uVar10 = float64_to_uint64_round_to_zero_mips64
                         (*(float64 *)((long)(env->active_fpu).fpr + lVar18 * 8 + lVar5 + -0x338),
                          pfVar2);
      *puVar19 = uVar10;
      bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar7 = ieee_ex_to_mips_mips64((uint)bVar4);
      uVar13 = (env->active_tc).msacsr;
      uVar12 = uVar13 >> 7 & 0x1f | 0x20;
      uVar17 = (uVar13 & 0x1000000) >> 0x18 & (uint)(bVar4 >> 6) | uVar7;
      uVar7 = (uVar7 & 0xfffffffc) + 1;
      if ((uVar13 & 0x1000000) == 0) {
        uVar7 = uVar17;
      }
      if (-1 < (char)bVar4) {
        uVar7 = uVar17;
      }
      uVar16 = (uint)((uVar13 >> 9 & 1) == 0 & (byte)uVar7 >> 2);
      uVar15 = uVar16 | uVar7;
      uVar17 = uVar7 & 0xfffffffc;
      if ((uVar16 != 0 || (uVar7 & 1) != 0) || (uVar13 & 0x100) != 0) {
        uVar17 = uVar15;
      }
      if ((uVar7 & 2) == 0) {
        uVar17 = uVar15;
      }
      if ((uVar17 & uVar12) == 0) {
        uVar7 = uVar17 << 0xc;
LAB_008c1c22:
        (env->active_tc).msacsr = uVar7 & 0x3f000 | uVar13;
        uVar12 = uVar13 >> 7 & 0x1f | 0x20;
      }
      else if ((uVar13 >> 0x12 & 1) == 0) {
        uVar7 = uVar17 << 0xc | uVar13;
        uVar13 = uVar13 & 0xfff80fff;
        goto LAB_008c1c22;
      }
      if ((uVar12 & uVar17) == 0) {
        if (0x7ff0000000000000 <
            (*(ulong *)((long)(env->active_fpu).fpr + lVar18 * 8 + lVar5 + -0x338) &
            0x7fffffffffffffff)) {
          uVar10 = 0;
          goto LAB_008c1c7e;
        }
      }
      else {
        fVar11 = float64_default_nan_mips64(pfVar2);
        uVar10 = (long)(int)uVar17 | fVar11 & 0xffffffffffffffc0 ^ 0x8000000000000;
LAB_008c1c7e:
        *puVar19 = uVar10;
      }
      lVar18 = 1;
      puVar19 = afStack_40;
      bVar6 = false;
    } while (bVar14);
  }
  uVar13 = (env->active_tc).msacsr;
  uVar7 = uVar13 >> 7 & 0x1f | 0x20;
  if ((uVar7 & uVar13 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar7);
  }
  (env->active_tc).msacsr = (uVar13 >> 0xc & 0x1f) << 2 | uVar13;
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fd = local_48;
  (&pfVar3->fd)[1] = afStack_40[0];
  return;
}

Assistant:

void helper_msa_ftrunc_u_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                            uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP0(pwx->w[i], to_uint32_round_to_zero, pws->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP0(pwx->d[i], to_uint64_round_to_zero, pws->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}